

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O0

void __thiscall Diligent::ArchiverImpl::Reset(ArchiverImpl *this)

{
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> Guard_3;
  lock_guard<std::mutex> Guard_2;
  lock_guard<std::mutex> Guard_1;
  lock_guard<std::mutex> Guard;
  ArchiverImpl *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&Guard_1,&this->m_SignaturesMtx);
  std::
  unordered_map<Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>_>_>
  ::clear(&this->m_Signatures);
  std::lock_guard<std::mutex>::~lock_guard(&Guard_1);
  std::lock_guard<std::mutex>::lock_guard(&Guard_2,&this->m_RenderPassesMtx);
  std::
  unordered_map<Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedRenderPassImpl>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedRenderPassImpl>_>_>_>
  ::clear(&this->m_RenderPasses);
  std::lock_guard<std::mutex>::~lock_guard(&Guard_2);
  std::lock_guard<std::mutex>::lock_guard(&Guard_3,&this->m_PipelinesMtx);
  std::
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>_>_>
  ::clear(&this->m_Pipelines);
  std::lock_guard<std::mutex>::~lock_guard(&Guard_3);
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->m_ShadersMtx);
  std::
  unordered_map<Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>_>_>_>
  ::clear(&this->m_Shaders);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void ArchiverImpl::Reset()
{
    {
        std::lock_guard<std::mutex> Guard{m_SignaturesMtx};
        m_Signatures.clear();
    }

    {
        std::lock_guard<std::mutex> Guard{m_RenderPassesMtx};
        m_RenderPasses.clear();
    }

    {
        std::lock_guard<std::mutex> Guard{m_PipelinesMtx};
        m_Pipelines.clear();
    }

    {
        std::lock_guard<std::mutex> Guard{m_ShadersMtx};
        m_Shaders.clear();
    }
}